

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int decode_signature_algorithms(st_ptls_signature_algorithms_t *sa,uint8_t **src,uint8_t *end)

{
  byte *pbVar1;
  long lVar2;
  int iVar3;
  uint16_t *value;
  long in_RDX;
  long *in_RSI;
  long in_RDI;
  uint16_t id;
  uint8_t *end_1;
  uint8_t *_src;
  uint64_t _block_size64;
  size_t _block_size;
  size_t _capacity;
  int ret;
  uint8_t *in_stack_ffffffffffffffa8;
  undefined6 in_stack_ffffffffffffffb0;
  undefined2 in_stack_ffffffffffffffb6;
  ulong local_30;
  long local_28;
  int local_1c;
  
  local_28 = 2;
  if ((ulong)(in_RDX - *in_RSI) < 2) {
    local_1c = 0x32;
  }
  else {
    local_30 = 0;
    do {
      pbVar1 = (byte *)*in_RSI;
      *in_RSI = (long)(pbVar1 + 1);
      local_30 = local_30 << 8 | (ulong)*pbVar1;
      local_28 = local_28 + -1;
    } while (local_28 != 0);
    if ((ulong)(in_RDX - *in_RSI) < local_30) {
      local_1c = 0x32;
    }
    else {
      value = (uint16_t *)(*in_RSI + local_30);
      do {
        iVar3 = ptls_decode16(value,(uint8_t **)
                                    CONCAT26(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0),
                              in_stack_ffffffffffffffa8);
        if (iVar3 != 0) {
          return iVar3;
        }
        if (*(ulong *)(in_RDI + 0x20) < 0x10) {
          lVar2 = *(long *)(in_RDI + 0x20);
          *(long *)(in_RDI + 0x20) = lVar2 + 1;
          *(undefined2 *)(in_RDI + lVar2 * 2) = in_stack_ffffffffffffffb6;
        }
      } while ((uint16_t *)*in_RSI != value);
      if ((uint16_t *)*in_RSI == value) {
        if (*in_RSI == in_RDX) {
          local_1c = 0;
        }
        else {
          local_1c = 0x32;
        }
      }
      else {
        local_1c = 0x32;
      }
    }
  }
  return local_1c;
}

Assistant:

static int decode_signature_algorithms(struct st_ptls_signature_algorithms_t *sa, const uint8_t **src, const uint8_t *end)
{
    int ret;

    ptls_decode_block(*src, end, 2, {
        do {
            uint16_t id;
            if ((ret = ptls_decode16(&id, src, end)) != 0)
                goto Exit;
            if (sa->count < PTLS_ELEMENTSOF(sa->list))
                sa->list[sa->count++] = id;
        } while (*src != end);
    });

    ret = 0;
Exit:
    return ret;
}